

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

vector<double,_std::allocator<double>_> *
Util::EigenVec2Std(vector<double,_std::allocator<double>_> *__return_storage_ptr__,VectorXd *vec1)

{
  pointer pdVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_21;
  value_type_conflict1 local_20;
  
  uVar4 = (vec1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  iVar2 = (int)uVar4;
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)iVar2,&local_20,&local_21);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pdVar1[uVar3] =
         (vec1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
         [uVar3];
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> EigenVec2Std(Eigen::VectorXd vec1){
		
		//locals
		int n = vec1.size();
		std::vector<double> vec2(n,0);

		//loop
		for (int ii = 0; ii < n; ++ii){
			vec2[ii] = vec1[ii];
		}

		//output
		return vec2;
	}